

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib655.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar3 = curl_easy_init();
    if (lVar3 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      iVar1 = 0x7e;
    }
    else {
      iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      if (((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar3,0x2821,"Test data"), iVar1 == 0)) &&
         (iVar1 = curl_easy_setopt(lVar3,0x4f30,resolver_alloc_cb_fail), iVar1 == 0)) {
        iVar2 = curl_easy_perform(lVar3);
        if (iVar2 == 6) {
          iVar1 = curl_easy_setopt(lVar3,0x4f30,resolver_alloc_cb_pass);
          if (iVar1 == 0) {
            iVar1 = curl_easy_perform(lVar3);
            if (iVar1 == 0) {
              iVar1 = 0;
              if (cb_count != 2) {
                curl_mfprintf(_stderr,"Unexpected number of callbacks: %d\n");
                iVar1 = 0x77;
              }
            }
            else {
              curl_mfprintf(_stderr,"curl_easy_perform failed.\n");
            }
          }
        }
        else {
          curl_mfprintf(_stderr,
                        "curl_easy_perform should have returned CURLE_COULDNT_RESOLVE_HOST but instead returned error %d\n"
                        ,iVar2);
          iVar1 = 0x77;
          if (iVar2 != 0) {
            iVar1 = iVar2;
          }
        }
      }
    }
    curl_easy_cleanup(lVar3);
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    iVar1 = 0x7e;
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  /* First set the URL that is about to receive our request. */
  test_setopt(curl, CURLOPT_URL, URL);

  test_setopt(curl, CURLOPT_RESOLVER_START_DATA, TEST_DATA_STRING);
  test_setopt(curl, CURLOPT_RESOLVER_START_FUNCTION, resolver_alloc_cb_fail);

  /* this should fail */
  res = curl_easy_perform(curl);
  if(res != CURLE_COULDNT_RESOLVE_HOST) {
    fprintf(stderr, "curl_easy_perform should have returned "
            "CURLE_COULDNT_RESOLVE_HOST but instead returned error %d\n", res);
    if(res == CURLE_OK)
      res = TEST_ERR_FAILURE;
    goto test_cleanup;
  }

  test_setopt(curl, CURLOPT_RESOLVER_START_FUNCTION, resolver_alloc_cb_pass);

  /* this should succeed */
  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "curl_easy_perform failed.\n");
    goto test_cleanup;
  }

  if(cb_count != 2) {
    fprintf(stderr, "Unexpected number of callbacks: %d\n", cb_count);
    res = TEST_ERR_FAILURE;
    goto test_cleanup;
  }

test_cleanup:
  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}